

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::serverupdate(void)

{
  int iVar1;
  uint uVar2;
  clientinfo *pcVar3;
  int iVar4;
  bool bVar5;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  vector<server::ban> vStack_48;
  void *local_38;
  
  if ((shouldstep == '\x01') && (gamepaused == '\0')) {
    gamemillis = gamemillis + curtime;
    if (gamemode == -1) {
      readdemo();
    }
    else if (((0x19 < gamemode + 3U) || ((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0))
            || (gamemillis < gamelimit)) {
      processevents();
      if ((curtime != 0) && (updateBanner(), 0 < DAT_00194e5c)) {
        lVar11 = 8;
        uVar13 = 0;
        do {
          lVar8 = sents;
          iVar4 = curtime;
          iVar1 = *(int *)(sents + -4 + lVar11);
          if (iVar1 != 0) {
            iVar9 = iVar1 - curtime;
            *(int *)(sents + -4 + lVar11) = iVar9;
            if (iVar9 == 0 || iVar1 < iVar4) {
              *(undefined4 *)(lVar8 + -4 + lVar11) = 0;
              *(undefined1 *)(lVar8 + lVar11) = 1;
              uVar7 = 0x19;
              uVar10 = uVar13 & 0xffffffff;
LAB_0013e351:
              sendf(-1,1,"ri2",uVar7,uVar10);
            }
            else if (10000 < iVar1 && iVar9 < 0x2711) {
              uVar2 = *(uint *)(lVar8 + -8 + lVar11);
              uVar10 = (ulong)uVar2;
              if ((uVar2 == 0x12) || (uVar2 == 0xf)) {
                uVar7 = 0x46;
                goto LAB_0013e351;
              }
            }
          }
          uVar13 = uVar13 + 1;
          lVar11 = lVar11 + 0xc;
        } while ((long)uVar13 < (long)DAT_00194e5c);
      }
      aiman::checkai();
      if (smode != (long *)0x0) {
        (**(code **)(*smode + 0x60))();
      }
    }
  }
  while ((DAT_00194b6c != 0 && (*(int *)(bannedips + 4) <= totalmillis))) {
    vector<server::ban>::remove(&vStack_48,(char *)&bannedips);
    if (local_38 != (void *)0x0) {
      operator_delete__(local_38);
    }
  }
  if (0 < DAT_00194cb4) {
    lVar11 = 0;
    do {
      lVar8 = *(long *)(connects + lVar11 * 8);
      if (15000 < totalmillis - *(int *)(lVar8 + 0x10)) {
        disconnect_client(*(int *)(lVar8 + 8),8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < DAT_00194cb4);
  }
  if (((nextexceeded != 0) && (nextexceeded < gamemillis)) &&
     ((0x19 < gamemode + 3U ||
      (((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) == 0 || (gamemillis < gamelimit)))))) {
    nextexceeded = 0;
    if (0 < (long)DAT_00194834) {
      lVar11 = (long)DAT_00194834 + 1;
      do {
        pcVar3 = *(clientinfo **)(clients + -0x10 + lVar11 * 8);
        if ((pcVar3->state).super_fpsstate.aitype == 0) {
          bVar5 = clientinfo::checkexceeded(pcVar3);
          if (bVar5) {
            disconnect_client(pcVar3->clientnum,4);
          }
          else {
            clientinfo::scheduleexceeded(pcVar3);
          }
        }
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
  }
  checkteamkills();
  if ((shouldstep == '\x01') && (gamepaused == '\0')) {
    if ((gamemode + 3U < 0x1a) &&
       ((((0x3ffffe8UL >> ((ulong)(gamemode + 3U) & 0x3f) & 1) != 0 && (smapname != '\0')) &&
        (curtime < gamemillis)))) {
      checkintermission(false);
    }
    if ((0 < interm) && (interm < gamemillis)) {
      if (demorecord != 0) {
        enddemorecord();
      }
      interm = -1;
      checkvotes(true);
    }
  }
  if (DAT_00194834 < 1) {
    shouldstep = false;
  }
  else {
    lVar11 = 0;
    do {
      pcVar3 = *(clientinfo **)(clients + lVar11 * 8);
      if ((long)multifragmillis <= (long)totalmillis - (pcVar3->state).lastfragmillis) {
        iVar1 = (pcVar3->state).multifrags;
        if (minmultikill <= iVar1) {
          lVar8 = (long)DAT_001952dc;
          if (0 < lVar8) {
            lVar12 = multikillmessages + 4;
            do {
              if (*(int *)(lVar12 + -4) == iVar1) goto LAB_0013e5c1;
              lVar12 = lVar12 + 0x108;
              lVar8 = lVar8 + -1;
            } while (lVar8 != 0);
          }
          lVar12 = 0;
LAB_0013e5c1:
          pcVar6 = colorname(pcVar3);
          if (lVar12 == 0) {
            out(3,"\f2%s scored a \f6%s (%d)",pcVar6,defmultikillmsg,
                (ulong)(uint)(pcVar3->state).multifrags);
          }
          else {
            out(3,"\f2%s scored a \f6%s",pcVar6,lVar12);
          }
        }
        (pcVar3->state).multifrags = 0;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < DAT_00194834);
    shouldstep = 0 < DAT_00194834;
  }
  return;
}

Assistant:

void serverupdate()
    {
        if(shouldstep && !gamepaused)
        {
            gamemillis += curtime;
            
            if(m_demo) readdemo();
            else if(!m_timed || gamemillis < gamelimit)
            {
                processevents();
                if(curtime)
                {
                    updateBanner();
                    loopv(sents) if(sents[i].spawntime) //spawn entities when timer reached
                    {
                        int oldtime = sents[i].spawntime;
                        sents[i].spawntime -= curtime;
                        if(sents[i].spawntime<=0)
                        {
                            sents[i].spawntime = 0;
                            sents[i].spawned = true;
                            sendf(-1, 1, "ri2", N_ITEMSPAWN, i);
                        }
                        else if(sents[i].spawntime<=10000 && oldtime>10000 && (sents[i].type==I_QUAD || sents[i].type==I_BOOST))
                        {
                            sendf(-1, 1, "ri2", N_ANNOUNCE, sents[i].type);
                        }
                    }
                }
                aiman::checkai();
                if(smode) smode->update();
            }
        }
        
        while(bannedips.length() && bannedips[0].expire-totalmillis <= 0) bannedips.remove(0);
        loopv(connects) if(totalmillis-connects[i]->connectmillis>15000) disconnect_client(connects[i]->clientnum, DISC_TIMEOUT);
        if(nextexceeded && gamemillis > nextexceeded && (!m_timed || gamemillis < gamelimit))
        {
            nextexceeded = 0;
            loopvrev(clients)
            {
                clientinfo &c = *clients[i];
                if(c.state.aitype != AI_NONE) continue;
                if(c.checkexceeded()) disconnect_client(c.clientnum, DISC_MSGERR);
                else c.scheduleexceeded();
            }
        }
        checkteamkills();
        
        if(shouldstep && !gamepaused)
        {
            if(m_timed && smapname[0] && gamemillis-curtime>0) checkintermission();
            if(interm > 0 && gamemillis>interm)
            {
                if(demorecord) enddemorecord();
                interm = -1;
                checkvotes(true);
            }
        }
       	//multi kill
        loopv(clients) {
            clientinfo *ci = clients[i];
            if(totalmillis - ci->state.lastfragmillis >= (int64_t)multifragmillis) {
                if(ci->state.multifrags >= minmultikill) {
                    char *msg = NULL;
                    loopv(multikillmessages) {
                        if(multikillmessages[i].frags == ci->state.multifrags) {
                            msg = multikillmessages[i].msg;
                            break;
                        }
                    }
                    if(msg) out(ECHO_SERV,"\f2%s scored a \f6%s", colorname(ci), msg);
                    else out(ECHO_SERV,"\f2%s scored a \f6%s (%d)", colorname(ci), defmultikillmsg, ci->state.multifrags);
                }
                ci->state.multifrags = 0;
            }
        }
        shouldstep = clients.length() > 0;
    }